

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O0

int Sfm_TimCriticalPath(Sfm_Tim_t *p,int Window)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj;
  int local_18;
  int SlackMax;
  int i;
  int Window_local;
  Sfm_Tim_t *p_local;
  
  iVar1 = (p->Delay * Window) / 100;
  Vec_IntClear(&p->vPath);
  Abc_NtkIncrementTravId(p->pNtk);
  local_18 = 0;
  do {
    iVar2 = Abc_NtkCoNum(p->pNtk);
    if (iVar2 <= local_18) {
      iVar1 = Vec_IntSize(&p->vPath);
      return iVar1;
    }
    pAVar3 = Abc_NtkCo(p->pNtk,local_18);
    pAVar3 = Abc_ObjFanin0(pAVar3);
    iVar2 = Abc_ObjIsCi(pAVar3);
    if ((iVar2 == 0) && (iVar2 = Abc_ObjFaninNum(pAVar3), iVar2 != 0)) {
      iVar2 = Abc_ObjIsNode(pAVar3);
      if (iVar2 == 0) {
        __assert_fail("Abc_ObjIsNode(pNext)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                      ,0xb7,"int Sfm_TimCriticalPath(Sfm_Tim_t *, int)");
      }
      iVar2 = Sfm_TimSlack(p,pAVar3);
      if (iVar2 <= iVar1) {
        Sfm_TimCriticalPath_int(p,pAVar3,&p->vPath,iVar1);
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

int Sfm_TimCriticalPath( Sfm_Tim_t * p, int Window )
{
    int i, SlackMax = p->Delay * Window / 100;
    Abc_Obj_t * pObj, * pNext; 
    Vec_IntClear( &p->vPath );
    Abc_NtkIncrementTravId( p->pNtk ); 
    Abc_NtkForEachCo( p->pNtk, pObj, i )
    {
        pNext = Abc_ObjFanin0(pObj);
        if ( Abc_ObjIsCi(pNext) || Abc_ObjFaninNum(pNext) == 0 )
            continue;
        assert( Abc_ObjIsNode(pNext) );
        if ( Sfm_TimSlack(p, pNext) <= SlackMax )
            Sfm_TimCriticalPath_int( p, pNext, &p->vPath, SlackMax );
    }
    return Vec_IntSize(&p->vPath);
}